

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_base_swaps<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
               (void)

{
  template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
  *this;
  undefined8 local_18c;
  undefined4 local_184;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>
              *)&m,&columns,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
            (&columns,&m);
  this = &m.matrix_.
          super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_true>_>_>_>
  ;
  Gudhi::persistence_matrix::
  Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>
  ::swap_columns(this,3,5);
  Gudhi::persistence_matrix::
  Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>
  ::swap_columns(this,5,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3),
             (_Vector_impl_data *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5));
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),
             (_Vector_impl_data *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1));
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
            (&columns,&m);
  Gudhi::persistence_matrix::
  Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>
  ::swap_rows(this,3,5);
  Gudhi::persistence_matrix::
  Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>_>_>
  ::swap_rows(this,5,1);
  local_18c = 0x500000002;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 4),&local_18c);
  local_18c = 0x300000001;
  local_184 = 4;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 6),&local_18c);
  local_18c = 0x500000000;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (columns.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),&local_18c);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true>>>
            (&columns,&m);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_base_swaps() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.swap_columns(3, 5);
  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    m.swap_columns(3, 1);
  } else {
    m.swap_columns(5, 1);
    columns[3].swap(columns[5]);
    columns[5].swap(columns[1]);
  }

  test_content_equality(columns, m);

  m.swap_rows(3, 5);
  m.swap_rows(5, 1);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {2, 5};
    columns[6] = {1, 3, 4};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {0, 5};
      columns[5] = {0, 2};
    } else {
      columns[1] = {0, 5};
    }
  } else {
    columns[4] = {{2, 4}, {5, 1}};
    columns[6] = {{1, 1}, {3, 4}, {4, 1}};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {{0, 1}, {5, 4}};
      columns[5] = {{0, 1}, {2, 4}};
    } else {
      columns[1] = {{0, 1}, {5, 4}};
    }
  }

  test_content_equality(columns, m);
}